

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addDecoration
          (Builder *this,Id id,Decoration decoration,
          vector<const_char_*,_std::allocator<const_char_*>_> *strings)

{
  bool bVar1;
  Instruction *this_00;
  size_type sVar2;
  reference ppcVar3;
  value_type local_50;
  char *local_48;
  char *string;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  Instruction *dec;
  vector<const_char_*,_std::allocator<const_char_*>_> *strings_local;
  Decoration decoration_local;
  Id id_local;
  Builder *this_local;
  
  if (decoration != DecorationMax) {
    this_00 = (Instruction *)::operator_new(0x60);
    spv::Instruction::Instruction(this_00,OpDecorateString);
    sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(strings);
    spv::Instruction::reserveOperands(this_00,sVar2 + 2);
    spv::Instruction::addIdOperand(this_00,id);
    spv::Instruction::addImmediateOperand(this_00,decoration);
    __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(strings);
    string = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(strings);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                       *)&string), bVar1) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&__end1);
      local_48 = *ppcVar3;
      spv::Instruction::addStringOperand(this_00,local_48);
      __gnu_cxx::
      __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
      ::operator++(&__end1);
    }
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_50,
               this_00);
    std::
    set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::insert(&this->decorations,&local_50);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_50);
  }
  return;
}

Assistant:

void Builder::addDecoration(Id id, Decoration decoration, const std::vector<const char*>& strings)
{
    if (decoration == spv::DecorationMax)
        return;

    Instruction* dec = new Instruction(OpDecorateString);
    dec->reserveOperands(strings.size() + 2);
    dec->addIdOperand(id);
    dec->addImmediateOperand(decoration);
    for (auto string : strings)
        dec->addStringOperand(string);

    decorations.insert(std::unique_ptr<Instruction>(dec));
}